

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

void __thiscall FIX::ScreenLog::onIncoming(ScreenLog *this,string *value)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  int in_ECX;
  long lVar6;
  long *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  string local_68;
  long *local_48;
  long local_40;
  long local_38;
  undefined8 uStack_30;
  
  if (this->m_incoming == true) {
    Mutex::lock((Mutex *)s_mutex);
    DateTime::nowUtc();
    (this->m_time).super_DateTime.m_date = (int)local_68._M_string_length;
    (this->m_time).super_DateTime.m_time = local_68.field_2._M_allocated_capacity;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<",1);
    UtcTimeStampConvertor::convert_abi_cxx11_
              (&local_68,(UtcTimeStampConvertor *)&this->m_time,(UtcTimeStamp *)0x9,in_ECX);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_68._M_dataplus._M_p,
                        CONCAT44(local_68._M_string_length._4_4_,(int)local_68._M_string_length));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->m_prefix)._M_dataplus._M_p,(this->m_prefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"incoming>",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  (",3);
    pcVar2 = (value->_M_dataplus)._M_p;
    local_88 = (long *)&local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + value->_M_string_length);
    lVar4 = local_80;
    if (local_80 != 0) {
      lVar6 = 0;
      do {
        if (*(char *)((long)local_88 + lVar6) == '\x01') {
          *(undefined1 *)((long)local_88 + lVar6) = 0x7c;
        }
        lVar6 = lVar6 + 1;
      } while (local_80 != lVar6);
    }
    if (local_88 == (long *)&local_78) {
      uStack_30 = uStack_70;
      local_88 = &local_38;
    }
    local_38 = CONCAT71(uStack_77,local_78);
    local_40 = local_80;
    local_80 = 0;
    local_78 = 0;
    local_48 = local_88;
    local_88 = (long *)&local_78;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_48,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if (local_88 != (long *)&local_78) {
      operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar1 = s_mutex._48_4_ + -1;
    bVar3 = (int)s_mutex._48_4_ < 2;
    s_mutex._48_4_ = iVar1;
    if (bVar3) {
      s_mutex._40_8_ = 0;
      pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
    }
  }
  return;
}

Assistant:

void onIncoming(const std::string &value) override {
    if (!m_incoming) {
      return;
    }
    Locker l(s_mutex);
    m_time.setCurrent();
    std::cout << "<" << UtcTimeStampConvertor::convert(m_time, 9) << ", " << m_prefix << ", " << "incoming>"
              << std::endl
              << "  (" << replaceSOHWithPipe(value) << ")" << std::endl;
  }